

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketClient.cpp
# Opt level: O3

bool __thiscall
SocketClient::writeTo(SocketClient *this,String *host,uint16_t port,uchar *f_data,uint size)

{
  uchar *__buf;
  element_type *peVar1;
  Buffer *this_00;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  Signal<std::function<void(std::shared_ptr<SocketClient>const&,int)>> *pSVar5;
  Log *pLVar6;
  size_t sVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  Signal<std::function<void(std::shared_ptr<SocketClient>const&,int)>> *pSVar11;
  size_t __n;
  bool bVar12;
  char cVar13;
  bool bVar14;
  int e;
  SharedPtr loop;
  SharedPtr socketPtr;
  Resolver resolver;
  int local_104;
  Log local_100;
  undefined8 local_f0;
  Signal<std::function<void(std::shared_ptr<SocketClient>const&,int)>> *local_e8;
  ulong local_e0;
  uchar *local_d8;
  Log local_d0;
  anon_union_8_2_1a2b307e_for_Flags<LogOutput::LogFlag>_1 local_c0;
  SharedPtr local_b8;
  Resolver local_a8;
  Log local_90;
  Log local_80;
  Log local_70;
  Buffer *local_60;
  ulong local_58;
  Log local_50;
  Log local_40;
  
  local_d8 = f_data;
  if ((size == 0) == (f_data != (uchar *)0x0)) {
    __assert_fail("(!size) == (!data)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                  ,0x1b1,
                  "bool SocketClient::writeTo(const String &, uint16_t, const unsigned char *, unsigned int)"
                 );
  }
  uVar10 = (ulong)size;
  std::__shared_ptr<SocketClient,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<SocketClient,void>
            ((__shared_ptr<SocketClient,(__gnu_cxx::_Lock_policy)2> *)&local_b8,
             (__weak_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2> *)this);
  Resolver::Resolver(&local_a8);
  if (port != 0) {
    Resolver::resolve(&local_a8,host,port,&local_b8);
  }
  local_f0 = (Signal<std::function<void(std::shared_ptr<SocketClient>const&,int)>> *)
             ((ulong)local_f0._4_4_ << 0x20);
  if (this->mWriteWait == false) {
    sVar7 = (this->mWriteBuffer).bufferSize;
    if ((sVar7 != 0) &&
       (pSVar11 = (Signal<std::function<void(std::shared_ptr<SocketClient>const&,int)>> *)
                  (sVar7 - this->mWriteOffset),
       pSVar11 != (Signal<std::function<void(std::shared_ptr<SocketClient>const&,int)>> *)0x0)) {
      local_f0 = (Signal<std::function<void(std::shared_ptr<SocketClient>const&,int)>> *)
                 &this->mSignalBytesWritten;
      pSVar5 = (Signal<std::function<void(std::shared_ptr<SocketClient>const&,int)>> *)0x0;
      local_e8 = pSVar11;
      local_e0 = uVar10;
      do {
        if ((Signal<std::function<void(std::shared_ptr<SocketClient>const&,int)>> *)
            (this->mWriteBuffer).bufferSize <= pSVar5) {
          __assert_fail("mWriteBuffer.size() > total",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                        ,0x1c6,
                        "bool SocketClient::writeTo(const String &, uint16_t, const unsigned char *, unsigned int)"
                       );
        }
        __n = (long)local_e8 - (long)pSVar5;
        if (local_a8.addr == (sockaddr *)0x0) {
          do {
            sVar3 = ::write(this->mFd,
                            pSVar5 + (long)((this->mWriteBuffer).bufferData + this->mWriteOffset),
                            __n);
            iVar2 = (int)sVar3;
            local_104 = iVar2;
            if (iVar2 != -1) goto LAB_00162987;
            piVar4 = __errno_location();
          } while (*piVar4 == 4);
        }
        else {
          do {
            sVar3 = sendto(this->mFd,
                           pSVar5 + (long)((this->mWriteBuffer).bufferData + this->mWriteOffset),__n
                           ,0x4000,(sockaddr *)local_a8.addr,(socklen_t)local_a8.size);
            iVar2 = (int)sVar3;
            local_104 = iVar2;
            if (iVar2 != -1) goto LAB_00162987;
            piVar4 = __errno_location();
          } while (*piVar4 == 4);
        }
        iVar2 = -1;
LAB_00162987:
        if (this->mLogsEnabled == true) {
          local_c0.mValue = 1;
          Log::Log(&local_90,LogLevel::Debug,(Flags<LogOutput::LogFlag> *)&local_c0);
          Log::write(&local_80,(int)&local_90,"SENT(1)",0xffffffff);
          Log::addStringStream<unsigned_long>(&local_70,(unsigned_long)&local_80);
          Log::write(&local_d0,(int)&local_70,"BYTES",0xffffffff);
          Log::addStringStream<int>(&local_100,(int)&local_d0);
          __errno_location();
          Log::addStringStream<int>(&local_40,(int)&local_100);
          if (local_40.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_40.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_d0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_d0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_70.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_70.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_80.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_80.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          iVar2 = local_104;
          if (local_90.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_90.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            iVar2 = local_104;
          }
        }
        if (iVar2 == -1) {
          piVar4 = __errno_location();
          if (*piVar4 != 0xb) {
            std::__shared_ptr<SocketClient,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<SocketClient,void>
                      ((__shared_ptr<SocketClient,(__gnu_cxx::_Lock_policy)2> *)&local_100,
                       (__weak_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2> *)this);
            local_d0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
                 5;
            pLVar6 = &local_100;
            Signal<std::function<void(std::shared_ptr<SocketClient>const&,SocketClient::Error)>>::
            operator()((Signal<std::function<void(std::shared_ptr<SocketClient>const&,SocketClient::Error)>>
                        *)&this->mSignalError,(shared_ptr<SocketClient> *)pLVar6,(Error *)&local_d0)
            ;
            iVar2 = (int)pLVar6;
            if (local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            close(this,iVar2);
            goto LAB_00162c38;
          }
          if (this->mWMode == Synchronous) {
            EventLoop::eventLoop();
            if ((EventLoop *)
                local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (EventLoop *)0x0) {
              cVar13 = '\0';
            }
            else {
              if ((int)pSVar5 != 0) {
                this->mWriteOffset = (size_t)(pSVar5 + this->mWriteOffset);
              }
              uVar9 = EventLoop::processSocket
                                ((EventLoop *)
                                 local_100.mData.
                                 super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                                 this->mFd,-1);
              cVar13 = '\x03';
              pSVar5 = (Signal<std::function<void(std::shared_ptr<SocketClient>const&,int)>> *)0x0;
              if ((uVar9 & 2) == 0) {
                cVar13 = this->mFd == -1;
              }
            }
            if (local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (cVar13 != '\0') {
              pSVar11 = local_e8;
              if (cVar13 != '\x03') goto LAB_00162c38;
              break;
            }
          }
          pSVar11 = local_e8;
          if (this->mWriteWait == true) {
            __assert_fail("!mWriteWait",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                          ,0x1e1,
                          "bool SocketClient::writeTo(const String &, uint16_t, const unsigned char *, unsigned int)"
                         );
          }
          EventLoop::eventLoop();
          if ((EventLoop *)
              local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (EventLoop *)0x0) {
            EventLoop::updateSocket
                      ((EventLoop *)
                       local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,this->mFd,7);
            this->mWriteWait = true;
          }
          if (local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          break;
        }
        Signal<std::function<void(std::shared_ptr<SocketClient>const&,int)>>::operator()
                  (local_f0,&local_b8,&local_104);
        pSVar5 = (Signal<std::function<void(std::shared_ptr<SocketClient>const&,int)>> *)
                 (ulong)(uint)((int)pSVar5 + local_104);
        pSVar11 = local_e8;
      } while (pSVar5 < local_e8);
      uVar10 = local_e0;
      local_f0 = (Signal<std::function<void(std::shared_ptr<SocketClient>const&,int)>> *)
                 ((ulong)local_f0 & 0xffffffff00000000);
      if ((int)pSVar5 != 0) {
        if (pSVar11 < pSVar5) {
          __assert_fail("total <= writeBufferSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                        ,0x1f2,
                        "bool SocketClient::writeTo(const String &, uint16_t, const unsigned char *, unsigned int)"
                       );
        }
        if (pSVar5 < pSVar11) {
          this->mWriteOffset = (size_t)(pSVar5 + this->mWriteOffset);
        }
        else {
          this->mWriteOffset = 0;
          if (0x7ffff < (this->mWriteBuffer).bufferSize) {
            free((this->mWriteBuffer).bufferData);
            (this->mWriteBuffer).bufferData = (uchar *)0x0;
            (this->mWriteBuffer).bufferReserved = 0;
          }
          (this->mWriteBuffer).bufferSize = 0;
        }
      }
    }
    bVar12 = this->mFd == -1;
    bVar14 = !bVar12;
    if (bVar12 || local_d8 == (uchar *)0x0) goto LAB_00162e86;
    if ((int)uVar10 == 0) {
      __assert_fail("data != 0 && size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                    ,0x201,
                    "bool SocketClient::writeTo(const String &, uint16_t, const unsigned char *, unsigned int)"
                   );
    }
    if ((this->mWriteBuffer).bufferSize == 0) {
      local_60 = &this->mWriteBuffer;
      local_e8 = (Signal<std::function<void(std::shared_ptr<SocketClient>const&,int)>> *)
                 &this->mSignalBytesWritten;
      local_f0 = (Signal<std::function<void(std::shared_ptr<SocketClient>const&,int)>> *)
                 ((ulong)local_f0 & 0xffffffff00000000);
      local_e0 = uVar10;
      do {
        uVar9 = (uint)local_e0 - (uint)local_f0;
        uVar8 = (ulong)uVar9;
        if ((uint)local_e0 < (uint)local_f0 || uVar9 == 0) {
          __assert_fail("size > total",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                        ,0x205,
                        "bool SocketClient::writeTo(const String &, uint16_t, const unsigned char *, unsigned int)"
                       );
        }
        local_58 = (ulong)local_f0 & 0xffffffff;
        __buf = local_d8 + local_58;
        if (local_a8.addr == (sockaddr *)0x0) {
          do {
            sVar3 = ::write(this->mFd,__buf,uVar8);
            iVar2 = (int)sVar3;
            local_104 = iVar2;
            if (iVar2 != -1) goto LAB_00162d41;
            piVar4 = __errno_location();
          } while (*piVar4 == 4);
        }
        else {
          do {
            sVar3 = sendto(this->mFd,__buf,uVar8,0x4000,(sockaddr *)local_a8.addr,
                           (socklen_t)local_a8.size);
            iVar2 = (int)sVar3;
            local_104 = iVar2;
            if (iVar2 != -1) goto LAB_00162d41;
            piVar4 = __errno_location();
          } while (*piVar4 == 4);
        }
        iVar2 = -1;
LAB_00162d41:
        if (this->mLogsEnabled == true) {
          local_c0.mValue = 1;
          Log::Log(&local_90,LogLevel::Debug,(Flags<LogOutput::LogFlag> *)&local_c0);
          Log::write(&local_80,(int)&local_90,"SENT(2)",0xffffffff);
          Log::addStringStream<unsigned_int>(&local_70,(uint)&local_80);
          Log::write(&local_d0,(int)&local_70,"BYTES",0xffffffff);
          Log::addStringStream<int>(&local_100,(int)&local_d0);
          __errno_location();
          Log::addStringStream<int>(&local_50,(int)&local_100);
          if (local_50.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_50.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_d0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_d0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_70.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_70.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_80.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_80.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          iVar2 = local_104;
          if (local_90.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_90.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            iVar2 = local_104;
          }
        }
        if (iVar2 == -1) {
          piVar4 = __errno_location();
          uVar10 = local_e0;
          if (*piVar4 != 0xb) {
            std::__shared_ptr<SocketClient,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<SocketClient,void>
                      ((__shared_ptr<SocketClient,(__gnu_cxx::_Lock_policy)2> *)&local_100,
                       (__weak_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2> *)this);
            local_d0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
                 5;
            pLVar6 = &local_100;
            Signal<std::function<void(std::shared_ptr<SocketClient>const&,SocketClient::Error)>>::
            operator()((Signal<std::function<void(std::shared_ptr<SocketClient>const&,SocketClient::Error)>>
                        *)&this->mSignalError,(shared_ptr<SocketClient> *)pLVar6,(Error *)&local_d0)
            ;
            iVar2 = (int)pLVar6;
            if (local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            close(this,iVar2);
            goto LAB_00162c38;
          }
          if (this->mWMode == Synchronous) {
            EventLoop::eventLoop();
            this_00 = local_60;
            peVar1 = local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            if ((EventLoop *)
                local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (EventLoop *)0x0) {
LAB_00162fd1:
              bVar14 = false;
            }
            else {
              sVar7 = (this->mWriteBuffer).bufferSize + uVar8;
              if ((this->mMaxWriteBufferSize != 0) && (this->mMaxWriteBufferSize < sVar7)) {
                close(this,(int)sVar7);
                goto LAB_00162fd1;
              }
              Buffer::reserve(local_60,sVar7);
              memcpy((this->mWriteBuffer).bufferData + (this->mWriteBuffer).bufferSize,
                     local_d8 + local_58,uVar8);
              Buffer::resize(this_00,uVar8 + (this->mWriteBuffer).bufferSize);
              if (this->mWriteOffset != 0) {
                __assert_fail("!mWriteOffset",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                              ,0x21e,
                              "bool SocketClient::writeTo(const String &, uint16_t, const unsigned char *, unsigned int)"
                             );
              }
              EventLoop::processSocket
                        ((EventLoop *)
                         local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,this->mFd,-1);
              bVar14 = this->mFd != -1;
            }
            if (local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((EventLoop *)peVar1 != (EventLoop *)0x0) goto LAB_00162e86;
          }
          if (this->mWriteWait == true) {
            __assert_fail("!mWriteWait",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                          ,0x224,
                          "bool SocketClient::writeTo(const String &, uint16_t, const unsigned char *, unsigned int)"
                         );
          }
          EventLoop::eventLoop();
          if ((EventLoop *)
              local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (EventLoop *)0x0) {
            EventLoop::updateSocket
                      ((EventLoop *)
                       local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,this->mFd,7);
            this->mWriteWait = true;
          }
          if (local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          goto LAB_00162c0a;
        }
        Signal<std::function<void(std::shared_ptr<SocketClient>const&,int)>>::operator()
                  (local_e8,&local_b8,&local_104);
        uVar9 = (uint)local_f0 + local_104;
        local_f0 = (Signal<std::function<void(std::shared_ptr<SocketClient>const&,int)>> *)
                   CONCAT44(local_f0._4_4_,uVar9);
        if ((uint)local_e0 < uVar9) {
          __assert_fail("total <= size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                        ,0x233,
                        "bool SocketClient::writeTo(const String &, uint16_t, const unsigned char *, unsigned int)"
                       );
        }
      } while (uVar9 != (uint)local_e0);
      bVar14 = true;
      goto LAB_00162e86;
    }
  }
LAB_00162c0a:
  bVar14 = true;
  uVar9 = (uint)uVar10 - (uint)local_f0;
  uVar8 = (ulong)uVar9;
  if ((uint)local_f0 <= (uint)uVar10 && uVar9 != 0) {
    sVar7 = (this->mWriteBuffer).bufferSize + uVar8;
    if ((this->mMaxWriteBufferSize == 0) || (sVar7 <= this->mMaxWriteBufferSize)) {
      Buffer::reserve(&this->mWriteBuffer,sVar7);
      memcpy((this->mWriteBuffer).bufferData + (this->mWriteBuffer).bufferSize,
             local_d8 + ((ulong)local_f0 & 0xffffffff),uVar8);
      Buffer::resize(&this->mWriteBuffer,uVar8 + (this->mWriteBuffer).bufferSize);
    }
    else {
      close(this,(int)sVar7);
LAB_00162c38:
      bVar14 = false;
    }
  }
LAB_00162e86:
  Resolver::~Resolver(&local_a8);
  if (local_b8.super___shared_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.super___shared_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return bVar14;
}

Assistant:

bool SocketClient::writeTo(const String& host, uint16_t port, const unsigned char* f_data, unsigned int size)
{
#ifdef _WIN32
    const char *data = reinterpret_cast<const char*>(f_data);
#else
    const unsigned char *data = f_data;
#endif

#ifdef RCT_SOCKETCLIENT_TIMING_ENABLED
    if (size) {
        mWrites.append(size);
    }
#endif

    assert((!size) == (!data));
    SocketClient::SharedPtr socketPtr = shared_from_this();

    Resolver resolver;
    if (port != 0)
        resolver.resolve(host, port, socketPtr);

    int e;
    unsigned int total = 0;

#ifdef HAVE_NOSIGNAL
    const int sendFlags = MSG_NOSIGNAL;
#else
    const int sendFlags = 0;
#endif

    if (!mWriteWait) {
        if (!mWriteBuffer.isEmpty()) {
            // assert(mWriteOffset < mWriteBuffer.size());
            const size_t writeBufferSize = mWriteBuffer.size() - mWriteOffset;
            while (total < writeBufferSize) {
                assert(mWriteBuffer.size() > total);
                if (resolver.addr) {
                    eintrwrap(e, ::sendto(mFd, reinterpret_cast<const char*>(mWriteBuffer.data()) + total + mWriteOffset, writeBufferSize - total,
                                          sendFlags, resolver.addr, resolver.size));
                } else {
                    eintrwrap(e, ::write(mFd, mWriteBuffer.data() + total + mWriteOffset, writeBufferSize - total));
                }
                DEBUG() << "SENT(1)" << (writeBufferSize - total) << "BYTES" << e << errno;
                if (e == -1) {
                    if (errno == EAGAIN || errno == EWOULDBLOCK) {
                        if (mWMode == Synchronous) {
                            if (EventLoop::SharedPtr loop = EventLoop::eventLoop()) {
                                if (total) {
                                    if (total < writeBufferSize) {
                                        mWriteOffset += total;
                                    } else {
                                        mWriteOffset = 0;
                                        mWriteBuffer.clear();
                                    }
                                    total = 0;
                                }
                                if (loop->processSocket(mFd) & EventLoop::SocketWrite)
                                    break;
                                if (mFd == -1)
                                    return false;
                            }
                        }
                        assert(!mWriteWait);
                        if (EventLoop::SharedPtr loop = EventLoop::eventLoop()) {
                            loop->updateSocket(mFd, EventLoop::SocketRead|EventLoop::SocketWrite|EventLoop::SocketOneShot);
                            mWriteWait = true;
                        }
                        break;
                    } else {
                        // bad
                        mSignalError(shared_from_this(), WriteError);
                        close();
                        return false;
                    }
                }
                mSignalBytesWritten(socketPtr, e);
                total += e;
            }
            if (total) {
                assert(total <= writeBufferSize);
                if (total < writeBufferSize) {
                    mWriteOffset += total;
                } else {
                    mWriteOffset = 0;
                    mWriteBuffer.clear();
                }
            }
        }

        if (mFd == -1 || !data) {
            return mFd != -1;
        }
        total = 0;

        assert(data != 0 && size > 0);

        if (mWriteBuffer.isEmpty()) {
            for (;;) {
                assert(size > total);
                if (resolver.addr) {
                    eintrwrap(e, ::sendto(mFd, data + total, size - total,
                                          sendFlags, resolver.addr, resolver.size));
                } else {
#ifdef _WIN32
                    eintrwrap(e, ::send(mFd, data + total, size - total, 0));
#else
                    eintrwrap(e, ::write(mFd, data + total, size - total));
#endif
                }
                DEBUG() << "SENT(2)" << (size - total) << "BYTES" << e << errno;
                if (e == -1) {
                    if (errno == EAGAIN || errno == EWOULDBLOCK) {
                        if (mWMode == Synchronous) {
                            if (EventLoop::SharedPtr loop = EventLoop::eventLoop()) {
                                // store the rest
                                const unsigned int rem = size - total;
                                if (mMaxWriteBufferSize && mWriteBuffer.size() + rem > mMaxWriteBufferSize) {
                                    close();
                                    return false;
                                }
                                mWriteBuffer.reserve(mWriteBuffer.size() + rem);
                                memcpy(mWriteBuffer.end(), data + total, rem);
                                mWriteBuffer.resize(mWriteBuffer.size() + rem);
                                assert(!mWriteOffset);

                                (void)loop->processSocket(mFd);
                                return isConnected();
                            }
                        }
                        assert(!mWriteWait);
                        if (EventLoop::SharedPtr loop = EventLoop::eventLoop()) {
                            loop->updateSocket(mFd, EventLoop::SocketRead|EventLoop::SocketWrite|EventLoop::SocketOneShot);
                            mWriteWait = true;
                        }
                        break;
                    } else {
                        // bad
                        mSignalError(shared_from_this(), WriteError);
                        close();
                        return false;
                    }
                }
                mSignalBytesWritten(socketPtr, e);
                total += e;
                assert(total <= size);
                if (total == size) {
                    // we're done
                    return true;
                }
            }
        }
    }

    if (total < size) {
        // store the rest
        const unsigned int rem = size - total;
        if (mMaxWriteBufferSize && mWriteBuffer.size() + rem > mMaxWriteBufferSize) {
            close();
            return false;
        }
        mWriteBuffer.reserve(mWriteBuffer.size() + rem);
        memcpy(mWriteBuffer.end(), data + total, rem);
        mWriteBuffer.resize(mWriteBuffer.size() + rem);
    }
    return true;
}